

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_int>_>::copyAppend
          (QGenericArrayOps<std::pair<QString,_int>_> *this,pair<QString,_int> *b,
          pair<QString,_int> *e)

{
  qsizetype *pqVar1;
  pair<QString,_int> *ppVar2;
  long lVar3;
  Data *pDVar4;
  
  if ((b != e) && (b < e)) {
    ppVar2 = (this->super_QArrayDataPointer<std::pair<QString,_int>_>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<std::pair<QString,_int>_>).size;
      pDVar4 = (b->first).d.d;
      ppVar2[lVar3].first.d.d = pDVar4;
      ppVar2[lVar3].first.d.ptr = (b->first).d.ptr;
      ppVar2[lVar3].first.d.size = (b->first).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type_conflict)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>
             + 1);
        UNLOCK();
      }
      ppVar2[lVar3].second = b->second;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<QString,_int>_>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }